

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O3

void __thiscall Handler::Output(Handler *this,uint16_t *startDay,uint16_t *endDay)

{
  LOCATION LVar1;
  pointer pRVar2;
  pointer pEVar3;
  pointer pSVar4;
  pointer pMVar5;
  pointer pRVar6;
  ostream *poVar7;
  ulong uVar8;
  long lVar9;
  RequestResult *requestRes;
  pointer pRVar10;
  char *pcVar11;
  MigrateResult *migrateRes;
  pointer pMVar12;
  ExtendResult *extendRes;
  pointer pEVar13;
  
  uVar8 = (ulong)*startDay;
  if (*startDay < *endDay) {
    do {
      pRVar2 = (this->result).super__Vector_base<Result,_std::allocator<Result>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(purchase, ",0xb);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,")\n",2);
      pEVar3 = *(pointer *)
                ((long)&pRVar2[uVar8].extendResult.
                        super__Vector_base<ExtendResult,_std::allocator<ExtendResult>_>._M_impl + 8)
      ;
      for (pEVar13 = *(pointer *)
                      &pRVar2[uVar8].extendResult.
                       super__Vector_base<ExtendResult,_std::allocator<ExtendResult>_>._M_impl;
          pEVar13 != pEVar3; pEVar13 = pEVar13 + 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
        pSVar4 = (this->servers).super__Vector_base<Server,_std::allocator<Server>_>._M_impl.
                 super__Vector_impl_data._M_start;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,pSVar4[pEVar13->serverIdx].model._M_dataplus._M_p,
                            pSVar4[pEVar13->serverIdx].model._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,")\n",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(migration, ",0xc);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,")\n",2);
      pMVar5 = *(pointer *)
                ((long)&pRVar2[uVar8].migrateResult.
                        super__Vector_base<MigrateResult,_std::allocator<MigrateResult>_>._M_impl +
                8);
      for (pMVar12 = pRVar2[uVar8].migrateResult.
                     super__Vector_base<MigrateResult,_std::allocator<MigrateResult>_>._M_impl.
                     super__Vector_impl_data._M_start; pMVar12 != pMVar5; pMVar12 = pMVar12 + 1) {
        LVar1 = pMVar12->location;
        if (LVar1 == NODE_A) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pMVar12->vmId);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          lVar9 = 5;
          pcVar11 = ", A)\n";
LAB_0010905f:
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar11,lVar9);
        }
        else {
          if (LVar1 == NODE_B) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pMVar12->vmId);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            lVar9 = 5;
            pcVar11 = ", B)\n";
            goto LAB_0010905f;
          }
          if (LVar1 == ALL) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pMVar12->vmId);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            lVar9 = 2;
            pcVar11 = ")\n";
            goto LAB_0010905f;
          }
        }
      }
      pRVar6 = *(pointer *)
                ((long)&pRVar2[uVar8].requestResult.
                        super__Vector_base<RequestResult,_std::allocator<RequestResult>_>._M_impl +
                8);
      for (pRVar10 = pRVar2[uVar8].requestResult.
                     super__Vector_base<RequestResult,_std::allocator<RequestResult>_>._M_impl.
                     super__Vector_impl_data._M_start; pRVar10 != pRVar6; pRVar10 = pRVar10 + 1) {
        LVar1 = pRVar10->location;
        if (LVar1 == NODE_A) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          lVar9 = 5;
          pcVar11 = ", A)\n";
LAB_00109121:
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar11,lVar9);
        }
        else {
          if (LVar1 == NODE_B) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            lVar9 = 5;
            pcVar11 = ", B)\n";
            goto LAB_00109121;
          }
          if (LVar1 == ALL) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            lVar9 = 2;
            pcVar11 = ")\n";
            goto LAB_00109121;
          }
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < *endDay);
  }
  fflush(_stdout);
  return;
}

Assistant:

void Handler::Output(const uint16_t &startDay, const uint16_t &endDay) {
    for (uint16_t i = startDay; i < endDay; ++i) {
        const Result &res = result[i];

        // 扩容结果
        const std::vector<ExtendResult> &extendResult = res.extendResult;
        std::cout << "(purchase, " << extendResult.size() << ")\n";
        for (const ExtendResult &extendRes : extendResult) {
            std::cout << "(" << servers[extendRes.serverIdx].model << ", " << extendRes.purchaseNum << ")\n";
        }

        // 迁移结果
        const std::vector<MigrateResult> &migrateResult = res.migrateResult;
        std::cout << "(migration, " << migrateResult.size() << ")\n";
        for (const MigrateResult &migrateRes : migrateResult) {
            if (migrateRes.location == ALL) {
                std::cout << "(" << migrateRes.vmId << ", " << migrateRes.purchasedServerId << ")\n";
            } else if (migrateRes.location == NODE_A) {
                std::cout << "(" << migrateRes.vmId << ", " << migrateRes.purchasedServerId << ", A)\n";
            } else if (migrateRes.location == NODE_B) {
                std::cout << "(" << migrateRes.vmId << ", " << migrateRes.purchasedServerId << ", B)\n";
            }
        }

        // 部署结果
        const std::vector<RequestResult> &requestResult = res.requestResult;
        for (const RequestResult &requestRes : requestResult) {
            if (requestRes.location == ALL) {
                std::cout << "(" << requestRes.purchasedServerId << ")\n";
            } else if (requestRes.location == NODE_A) {
                std::cout << "(" << requestRes.purchasedServerId << ", A)\n";
            } else if (requestRes.location == NODE_B) {
                std::cout << "(" << requestRes.purchasedServerId << ", B)\n";
            }
        }
    }

    fflush(stdout);
}